

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_force_recheck(torrent *this,status_t status,storage_error *error)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string_view job_name;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_38;
  
  state_updated(this);
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    if ((status.m_val & 8) != 0) {
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var,iVar3) + 0x68) & 8) != 0) {
        iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)&stack0xffffffffffffffc0);
        alert_manager::emplace_alert<libtorrent::oversized_file_alert,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar3),
                   (torrent_handle *)&stack0xffffffffffffffc0);
        if (local_38._M_head_impl != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)((long)&((local_38._M_head_impl)->m_piece_map).
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    .
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            iVar3 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar3 = *(int *)((long)&((local_38._M_head_impl)->m_piece_map).
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    .
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            *(int *)((long)&((local_38._M_head_impl)->m_piece_map).
                            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            .
                            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar3 + -1;
          }
          if (iVar3 == 1) {
            (*(code *)((local_38._M_head_impl)->m_piece_map).
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      .
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
      }
    }
    if ((error->ec).val_ == 0) {
      if ((status.m_val & 7) == 0) {
        files_checked(this);
      }
      else {
        this->field_0x606 = this->field_0x606 & 0xf0;
        *(undefined2 *)&this->field_0x604 = 0;
        this->m_checking_piece = 0;
        this->m_num_checked_pieces = 0;
        set_state(this,checking_files);
        if ((this->field_0x600 & 1) != 0) {
          pause(this);
        }
        uVar2 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
        if ((((uVar2 & 0xe00000008000000) == 0x200000000000000) && ((uVar2 & 0x14000000) == 0)) &&
           ((this->m_error).failed_ == false)) {
          start_checking(this);
        }
        else {
          (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2c])();
        }
      }
    }
    else {
      job_name._M_str = "force_recheck";
      job_name._M_len = 0xd;
      handle_disk_error(this,job_name,error,(peer_connection *)0x0,none);
    }
  }
  return;
}

Assistant:

void torrent::on_force_recheck(status_t const status, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		// hold a reference until this function returns
		state_updated();

		if (m_abort) return;

		if (status & disk_status::oversized_file)
		{
			if (m_ses.alerts().should_post<oversized_file_alert>())
				m_ses.alerts().emplace_alert<oversized_file_alert>(get_handle());
		}

		if (error)
		{
			handle_disk_error("force_recheck", error);
			return;
		}
		bool const has_error_status
			= (status & disk_status::fatal_disk_error)
			|| (status & disk_status::need_full_check)
			|| (status & disk_status::file_exist);
		if (!has_error_status)
		{
			// if there are no files, just start
			files_checked();
		}
		else
		{
			m_progress_ppm = 0;
			m_checking_piece = piece_index_t(0);
			m_num_checked_pieces = piece_index_t(0);

			set_state(torrent_status::checking_files);
			if (m_auto_managed) pause(torrent_handle::graceful_pause);
			if (should_check_files()) start_checking();
			else m_ses.trigger_auto_manage();
		}
	}
	catch (...) { handle_exception(); }